

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_hasUnlinkedUnitsWhenUnitsObjectsWithSameNameAddedToModelAndVariable_Test::TestBody
          (Units_hasUnlinkedUnitsWhenUnitsObjectsWithSameNameAddedToModelAndVariable_Test *this)

{
  char cVar1;
  ModelPtr m;
  AssertionResult gtest_ar_;
  VariablePtr v1;
  UnitsPtr u2;
  ComponentPtr c1;
  UnitsPtr u1;
  long *local_a0;
  AssertionResult local_98;
  long local_88 [2];
  AssertHelper local_78 [8];
  shared_ptr *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  char local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  shared_ptr *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  shared_ptr *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Variable::create();
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"a_unit","");
  libcellml::NamedEntity::setName(local_20);
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"a_unit","");
  libcellml::NamedEntity::setName(local_40);
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  libcellml::Variable::setUnits(local_50);
  libcellml::Component::addVariable(local_30);
  libcellml::ComponentEntity::addComponent(local_70);
  libcellml::Model::addUnits(local_70);
  local_60[0] = libcellml::Model::hasUnlinkedUnits();
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,local_60,"m->hasUnlinkedUnits()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x19e,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if ((long *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    }
    if (local_a0 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
      local_a0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return;
}

Assistant:

TEST(Units, hasUnlinkedUnitsWhenUnitsObjectsWithSameNameAddedToModelAndVariable)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    u1->setName("a_unit");
    u2->setName("a_unit");

    v1->setUnits(u1);

    c1->addVariable(v1);
    m->addComponent(c1);
    m->addUnits(u2);

    EXPECT_TRUE(m->hasUnlinkedUnits());
}